

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O3

add_torrent_params *
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,bdecode_node *rd,error_code *ec,
          int piece_limit)

{
  byte *pbVar1;
  sha256_hash *psVar2;
  torrent_flags_t *current_flags;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *this;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *this_00;
  pointer *ppbVar3;
  uint *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator __position;
  pointer pbVar5;
  iterator __position_00;
  _Head_base<0UL,_unsigned_int_*,_false> _Var6;
  tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_> tVar7;
  iterator iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  pointer pbVar14;
  bool bVar15;
  byte bVar16;
  type_t tVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  pointer pbVar22;
  int64_t iVar23;
  mapped_type *pmVar24;
  char *pcVar25;
  pointer psVar26;
  mapped_type *this_02;
  storage_mode_t sVar27;
  size_t sVar28;
  char **in;
  char **in_00;
  char **in_01;
  char **in_02;
  int j;
  pointer pvVar30;
  int i_4;
  long lVar31;
  int i_1;
  int i;
  info_hash_t *piVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  string_view key_22;
  string_view key_23;
  string_view sVar40;
  error_code eVar41;
  string_view sVar42;
  string_view sVar43;
  span<const_char> sVar44;
  error_code eVar45;
  string_view key_24;
  string_view key_25;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  string_view key_30;
  string_view key_31;
  string_view key_32;
  string_view key_33;
  string_view key_34;
  string_view key_35;
  string_view key_36;
  string_view key_37;
  string_view key_38;
  string_view key_39;
  string_view key_40;
  string_view key_41;
  string_view url;
  piece_index_t piece;
  bdecode_node mapped_files;
  bdecode_node file_priority;
  bdecode_node trackers;
  int tier;
  bdecode_node url_list;
  bdecode_node trees;
  bdecode_node info;
  char *ptr;
  bdecode_node local_2e0;
  vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *local_2a0;
  int64_t local_298;
  key_type local_28c;
  bdecode_node local_288;
  vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *local_240;
  bdecode_node local_238;
  string_view local_1f8;
  pointer local_1e8;
  data_union local_1b8 [2];
  bdecode_node local_178;
  bdecode_node local_138;
  bdecode_node local_f0;
  vector<std::vector<sha256_hash>,_file_index_t> *local_b0;
  pointer local_a8;
  pointer pbStack_a0;
  uint local_98;
  bdecode_node local_90;
  sha256_hash local_50;
  char *pcVar29;
  
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  tVar17 = bdecode_node::type(rd);
  if (tVar17 != dict_t) {
    eVar41 = errors::make_error_code(not_a_dictionary);
LAB_00299532:
    *ec = eVar41;
    return __return_storage_ptr__;
  }
  sVar40._M_str = "allocation";
  sVar40._M_len = 10;
  bdecode_node::dict_find_string(&local_f0,rd,sVar40);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_f0);
  if (bVar15) {
    sVar40 = bdecode_node::string_value(&local_f0);
    if ((sVar40._M_len == 8) && (*(long *)sVar40._M_str == 0x657461636f6c6c61)) {
      sVar27 = storage_mode_allocate;
    }
    else {
      sVar40 = bdecode_node::string_value(&local_f0);
      sVar27 = storage_mode_sparse;
      if (sVar40._M_len == 4) {
        sVar27 = (storage_mode_t)(*(int *)sVar40._M_str != 0x6c6c7566);
      }
    }
    __return_storage_ptr__->storage_mode = sVar27;
  }
  if (local_f0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar42._M_str = "file-format";
  sVar42._M_len = 0xb;
  sVar40 = bdecode_node::dict_find_string_value(rd,sVar42,(string_view)ZEXT816(0));
  pcVar25 = sVar40._M_str;
  if ((sVar40._M_len != 0x16) ||
     (auVar37[0] = -(pcVar25[6] == 'r'), auVar37[1] = -(pcVar25[7] == 'e'),
     auVar37[2] = -(pcVar25[8] == 'n'), auVar37[3] = -(pcVar25[9] == 't'),
     auVar37[4] = -(pcVar25[10] == ' '), auVar37[5] = -(pcVar25[0xb] == 'r'),
     auVar37[6] = -(pcVar25[0xc] == 'e'), auVar37[7] = -(pcVar25[0xd] == 's'),
     auVar37[8] = -(pcVar25[0xe] == 'u'), auVar37[9] = -(pcVar25[0xf] == 'm'),
     auVar37[10] = -(pcVar25[0x10] == 'e'), auVar37[0xb] = -(pcVar25[0x11] == ' '),
     auVar37[0xc] = -(pcVar25[0x12] == 'f'), auVar37[0xd] = -(pcVar25[0x13] == 'i'),
     auVar37[0xe] = -(pcVar25[0x14] == 'l'), auVar37[0xf] = -(pcVar25[0x15] == 'e'),
     auVar34[0] = -(*pcVar25 == 'l'), auVar34[1] = -(pcVar25[1] == 'i'),
     auVar34[2] = -(pcVar25[2] == 'b'), auVar34[3] = -(pcVar25[3] == 't'),
     auVar34[4] = -(pcVar25[4] == 'o'), auVar34[5] = -(pcVar25[5] == 'r'),
     auVar34[6] = -(pcVar25[6] == 'r'), auVar34[7] = -(pcVar25[7] == 'e'),
     auVar34[8] = -(pcVar25[8] == 'n'), auVar34[9] = -(pcVar25[9] == 't'),
     auVar34[10] = -(pcVar25[10] == ' '), auVar34[0xb] = -(pcVar25[0xb] == 'r'),
     auVar34[0xc] = -(pcVar25[0xc] == 'e'), auVar34[0xd] = -(pcVar25[0xd] == 's'),
     auVar34[0xe] = -(pcVar25[0xe] == 'u'), auVar34[0xf] = -(pcVar25[0xf] == 'm'),
     auVar34 = auVar34 & auVar37,
     (ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) != 0xffff)) {
    eVar41 = errors::make_error_code(invalid_file_tag);
    goto LAB_00299532;
  }
  sVar43._M_str = "file-version";
  sVar43._M_len = 0xc;
  local_298 = bdecode_node::dict_find_int_value(rd,sVar43,1);
  if (local_298 - 3U < 0xfffffffffffffffe) {
    eVar41 = errors::make_error_code(invalid_file_tag);
    goto LAB_00299532;
  }
  key._M_str = "info-hash";
  key._M_len = 9;
  sVar40 = bdecode_node::dict_find_string_value(rd,key,(string_view)ZEXT816(0));
  pcVar25 = sVar40._M_str;
  key_00._M_str = "info-hash2";
  key_00._M_len = 10;
  sVar42 = bdecode_node::dict_find_string_value(rd,key_00,(string_view)ZEXT816(0));
  pcVar29 = sVar42._M_str;
  if (sVar42._M_len != 0x20 && sVar40._M_len != 0x14) {
    eVar41 = errors::make_error_code(missing_info_hash);
    goto LAB_00299532;
  }
  key_01._M_str = "name";
  key_01._M_len = 4;
  sVar43 = bdecode_node::dict_find_string_value(rd,key_01,(string_view)ZEXT816(0));
  ::std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->name,0,
             (char *)(__return_storage_ptr__->name)._M_string_length,(ulong)sVar43._M_str);
  if (sVar40._M_len == 0x14) {
    (__return_storage_ptr__->info_hashes).v1.m_number._M_elems[4] = *(uint *)(pcVar25 + 0x10);
    uVar9 = *(undefined8 *)(pcVar25 + 8);
    *(undefined8 *)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems =
         *(undefined8 *)pcVar25;
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 2) = uVar9;
  }
  if (sVar42._M_len == 0x20) {
    uVar9 = *(undefined8 *)pcVar29;
    uVar10 = *(undefined8 *)(pcVar29 + 8);
    uVar11 = *(undefined8 *)(pcVar29 + 0x18);
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 4) =
         *(undefined8 *)(pcVar29 + 0x10);
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 6) = uVar11;
    *(undefined8 *)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems = uVar9;
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 2) = uVar10;
  }
  key_24._M_str = "info";
  key_24._M_len = 4;
  bdecode_node::dict_find_dict(&local_f0,rd,key_24);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_f0);
  if (!bVar15) goto LAB_0029992b;
  sVar44 = bdecode_node::data_section(&local_f0);
  lcrypto::hasher::hasher((hasher *)&local_288,sVar44);
  lcrypto::hasher::final((sha1_hash *)&local_a8,(hasher *)&local_288);
  sVar44 = bdecode_node::data_section(&local_f0);
  lcrypto::hasher256::hasher256((hasher256 *)&local_238,sVar44);
  lcrypto::hasher256::final(&local_50,(hasher256 *)&local_238);
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_98;
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = local_a8;
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_a0;
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = (char)local_50.m_number._M_elems[0];
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = local_50.m_number._M_elems[0]._1_1_;
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = local_50.m_number._M_elems[0]._2_1_;
  local_138.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_50.m_number._M_elems[0]._3_1_;
  local_138.m_root_tokens._0_1_ = (char)local_50.m_number._M_elems[1];
  local_138.m_root_tokens._1_1_ = local_50.m_number._M_elems[1]._1_1_;
  local_138.m_root_tokens._2_1_ = local_50.m_number._M_elems[1]._2_1_;
  local_138.m_root_tokens._3_1_ = local_50.m_number._M_elems[1]._3_1_;
  local_138._28_8_ = local_50.m_number._M_elems._8_8_;
  local_138._36_8_ = local_50.m_number._M_elems._16_8_;
  local_138.m_token_idx = local_50.m_number._M_elems[6];
  local_138.m_last_index = local_50.m_number._M_elems[7];
  lcrypto::hasher256::~hasher256((hasher256 *)&local_238);
  lcrypto::hasher::~hasher((hasher *)&local_288);
  bVar15 = digest32<160L>::is_all_zeros(&(__return_storage_ptr__->info_hashes).v1);
  if (bVar15) {
LAB_0029978c:
    psVar2 = &(__return_storage_ptr__->info_hashes).v2;
    bVar15 = digest32<256L>::is_all_zeros(psVar2);
    if (!bVar15) {
      auVar39[0] = -(local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                    (char)(psVar2->m_number)._M_elems[0]);
      auVar39[1] = -(local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 1))
      ;
      auVar39[2] = -(local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 2))
      ;
      auVar39[3] = -(local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 3))
      ;
      auVar39[4] = -((char)local_138.m_root_tokens ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[1]);
      auVar39[5] = -(local_138.m_root_tokens._1_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 5))
      ;
      auVar39[6] = -(local_138.m_root_tokens._2_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 6))
      ;
      auVar39[7] = -(local_138.m_root_tokens._3_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 7))
      ;
      auVar39[8] = -(local_138.m_root_tokens._4_1_ ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[2]);
      auVar39[9] = -(local_138.m_root_tokens._5_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 9))
      ;
      auVar39[10] = -(local_138.m_root_tokens._6_1_ ==
                     *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 10
                              ));
      auVar39[0xb] = -(local_138.m_root_tokens._7_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xb));
      auVar39[0xc] = -((char)local_138.m_buffer ==
                      (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[3]);
      auVar39[0xd] = -(local_138.m_buffer._1_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xd));
      auVar39[0xe] = -(local_138.m_buffer._2_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xe));
      auVar39[0xf] = -(local_138.m_buffer._3_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xf));
      auVar36[0] = -(local_138.m_buffer._4_1_ ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[4]);
      auVar36[1] = -(local_138.m_buffer._5_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x11));
      auVar36[2] = -(local_138.m_buffer._6_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x12));
      auVar36[3] = -(local_138.m_buffer._7_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x13));
      auVar36[4] = -((char)local_138.m_buffer_size ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[5]);
      auVar36[5] = -(local_138.m_buffer_size._1_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x15));
      auVar36[6] = -(local_138.m_buffer_size._2_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x16));
      auVar36[7] = -(local_138.m_buffer_size._3_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x17));
      auVar36[8] = -((char)local_138.m_token_idx ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[6]);
      auVar36[9] = -(local_138.m_token_idx._1_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x19));
      auVar36[10] = -(local_138.m_token_idx._2_1_ ==
                     *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                              0x1a));
      auVar36[0xb] = -(local_138.m_token_idx._3_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1b));
      auVar36[0xc] = -((char)local_138.m_last_index ==
                      (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[7]);
      auVar36[0xd] = -(local_138.m_last_index._1_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1d));
      auVar36[0xe] = -(local_138.m_last_index._2_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1e));
      auVar36[0xf] = -(local_138.m_last_index._3_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1f));
      auVar36 = auVar36 & auVar39;
      if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) goto LAB_002997d6;
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         local_288.m_tokens.
         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_288.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._0_16_ = auVar13 << 0x40;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::info_hash_t_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_288 + 8),
               (torrent_info **)&local_288,(allocator<libtorrent::torrent_info> *)&local_238,
               (info_hash_t *)&local_138);
    local_238.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_238.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ =
         local_238.m_tokens.
         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_ & 0xffffff00;
    local_238.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
    bVar15 = torrent_info::parse_info_section
                       ((torrent_info *)
                        local_288.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_f0,(error_code *)&local_238
                        ,piece_limit);
    if (bVar15) {
      pbVar22 = local_288.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_02._M_str = "creation date";
      key_02._M_len = 0xd;
      iVar23 = bdecode_node::dict_find_int_value(rd,key_02,0);
      torrent_info::internal_set_creation_date((torrent_info *)pbVar22,iVar23);
      pbVar22 = local_288.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_03._M_str = "created by";
      key_03._M_len = 10;
      sVar40 = bdecode_node::dict_find_string_value
                         (rd,key_03,(string_view)(ZEXT816(0x3de9eb) << 0x40));
      torrent_info::internal_set_creator((torrent_info *)pbVar22,sVar40);
      pbVar22 = local_288.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_04._M_str = "comment";
      key_04._M_len = 7;
      sVar40 = bdecode_node::dict_find_string_value
                         (rd,key_04,(string_view)(ZEXT816(0x3de9eb) << 0x40));
      torrent_info::internal_set_comment((torrent_info *)pbVar22,sVar40);
    }
    else {
      ec->val_ = (int)local_238.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      ec->failed_ = (bool)(char)local_238.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_;
      *(int3 *)&ec->field_0x5 =
           (int3)(local_238.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ >> 8);
      ec->cat_ = (error_category *)
                 local_238.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    pbVar22 = local_288.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = local_288.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_288.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = (__return_storage_ptr__->ti).
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (__return_storage_ptr__->ti).
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pbVar22;
    (__return_storage_ptr__->ti).
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar14;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_288.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_288.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  else {
    uVar20 = (__return_storage_ptr__->info_hashes).v1.m_number._M_elems[4];
    auVar35[0] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[0] ==
                  (char)local_138.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    auVar35[1] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 1)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._1_1_);
    auVar35[2] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 2)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._2_1_);
    auVar35[3] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 3)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._3_1_);
    auVar35[4] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[1] ==
                  local_138.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_1_);
    auVar35[5] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 5)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._5_1_);
    auVar35[6] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 6)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._6_1_);
    auVar35[7] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 7)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._7_1_);
    auVar35[8] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[2] ==
                  (char)local_138.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    auVar35[9] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 9)
                  == local_138.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._1_1_);
    auVar35[10] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 10)
                   == local_138.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._2_1_);
    auVar35[0xb] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xb) ==
                    local_138.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._3_1_);
    auVar35[0xc] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[3] ==
                    local_138.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_1_);
    auVar35[0xd] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xd) ==
                    local_138.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._5_1_);
    auVar35[0xe] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xe) ==
                    local_138.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._6_1_);
    auVar35[0xf] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xf) ==
                    local_138.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._7_1_);
    auVar38[0] = -((char)(uint)local_138.m_tokens.
                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage == (char)uVar20);
    auVar38[1] = -((char)((uint)local_138.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 8) ==
                  (char)(uVar20 >> 8));
    auVar38[2] = -((char)((uint)local_138.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x10) ==
                  (char)(uVar20 >> 0x10));
    auVar38[3] = -((char)((uint)local_138.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x18) ==
                  (char)(uVar20 >> 0x18));
    auVar38[4] = 0xff;
    auVar38[5] = 0xff;
    auVar38[6] = 0xff;
    auVar38[7] = 0xff;
    auVar38[8] = 0xff;
    auVar38[9] = 0xff;
    auVar38[10] = 0xff;
    auVar38[0xb] = 0xff;
    auVar38[0xc] = 0xff;
    auVar38[0xd] = 0xff;
    auVar38[0xe] = 0xff;
    auVar38[0xf] = 0xff;
    auVar35 = auVar35 & auVar38;
    if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0029978c;
LAB_002997d6:
    eVar45 = errors::make_error_code(mismatching_info_hash);
    ec->val_ = eVar45.val_;
    ec->failed_ = eVar45.failed_;
    *(int3 *)&ec->field_0x5 = eVar45._5_3_;
    ec->cat_ = eVar45.cat_;
  }
LAB_0029992b:
  psVar2 = &(__return_storage_ptr__->info_hashes).v2;
  bVar15 = digest32<256L>::is_all_zeros(psVar2);
  piVar32 = &__return_storage_ptr__->info_hashes;
  if (!bVar15) {
    piVar32 = (info_hash_t *)psVar2;
  }
  uVar9 = *(undefined8 *)((piVar32->v1).m_number._M_elems + 2);
  *(undefined8 *)(__return_storage_ptr__->info_hash).m_number._M_elems =
       *(undefined8 *)(piVar32->v1).m_number._M_elems;
  *(undefined8 *)((__return_storage_ptr__->info_hash).m_number._M_elems + 2) = uVar9;
  (__return_storage_ptr__->info_hash).m_number._M_elems[4] = (piVar32->v1).m_number._M_elems[4];
  key_25._M_str = "trees";
  key_25._M_len = 5;
  bdecode_node::dict_find_list(&local_138,rd,key_25);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_138);
  if (bVar15) {
    iVar18 = bdecode_node::list_size(&local_138);
    local_b0 = &__return_storage_ptr__->merkle_trees;
    ::std::
    vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
    ::reserve(&local_b0->
               super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              ,(long)iVar18);
    iVar18 = bdecode_node::list_size(&local_138);
    local_2a0 = (vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                &__return_storage_ptr__->verified_leaf_hashes;
    ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::reserve
              ((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)local_2a0,
               (long)iVar18);
    local_240 = (vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                &__return_storage_ptr__->merkle_tree_mask;
    for (iVar18 = 0; iVar19 = bdecode_node::list_size(&local_138), iVar18 < iVar19;
        iVar18 = iVar18 + 1) {
      bdecode_node::list_at(&local_288,&local_138,iVar18);
      tVar17 = bdecode_node::type(&local_288);
      if (tVar17 != dict_t) {
LAB_00299d70:
        if (local_288.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_288.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      }
      key_26._M_str = "hashes";
      key_26._M_len = 6;
      bdecode_node::dict_find_string(&local_238,&local_288,key_26);
      bVar15 = bdecode_node::operator_cast_to_bool(&local_238);
      if ((!bVar15) || (uVar20 = bdecode_node::string_length(&local_238), (uVar20 & 0x1f) != 0)) {
        pvVar12 = (void *)CONCAT44(local_238.m_tokens.
                                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_238.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
        if (pvVar12 != (void *)0x0) {
          operator_delete(pvVar12,(long)local_238.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar12);
        }
        goto LAB_00299d70;
      }
      __position._M_current =
           (__return_storage_ptr__->merkle_trees).
           super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           .
           super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->merkle_trees).
          super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          .
          super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ::_M_realloc_insert<>
                  (&local_b0->
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ,__position);
        pvVar30 = (__return_storage_ptr__->merkle_trees).
                  super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                  .
                  super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position._M_current)->
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar30 = (__return_storage_ptr__->merkle_trees).
                  super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                  .
                  super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->merkle_trees).
        super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        .
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar30;
      }
      sVar40 = bdecode_node::string_value(&local_238);
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      reserve(pvVar30 + -1,sVar40._M_len >> 5);
      local_1f8 = bdecode_node::string_value(&local_238);
      pbVar22 = (pointer)local_1f8._M_len;
      while (pbVar22 != (pointer)0x0) {
        ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
                   ((__return_storage_ptr__->merkle_trees).
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    .
                    super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1),
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_1f8);
        if (local_1f8._M_len < (pointer)0x20) {
          ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     0x20);
        }
        pbVar22 = (pointer)(local_1f8._M_len + -0x20);
        local_1f8._M_str = (char *)((long)local_1f8._M_str + 0x20);
        local_1f8._M_len = (size_t)pbVar22;
      }
      key_27._M_str = "verified";
      key_27._M_len = 8;
      bdecode_node::dict_find_string((bdecode_node *)&local_1f8,&local_288,key_27);
      bVar15 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_1f8);
      if (bVar15) {
        sVar40 = bdecode_node::string_value((bdecode_node *)&local_1f8);
        if (local_298 == 1) {
          local_178.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_178.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar40._M_len)
          ;
          ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
          emplace_back<int>((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)
                            local_2a0,(int *)&local_178);
          if (sVar40._M_len != 0) {
            pbVar5 = (__return_storage_ptr__->verified_leaf_hashes).
                     super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                     super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar28 = 0;
            do {
              if ((&((pointer)sVar40._M_str)->field_0x0)[sVar28] == '1') {
                uVar20 = 0x80000000 >> ((byte)sVar28 & 0x1f);
                iVar19 = (int)sVar28;
                iVar21 = iVar19 + 0x1f;
                if (-1 < iVar19) {
                  iVar21 = iVar19;
                }
                puVar4 = (uint *)((long)pbVar5[-1].m_buf.
                                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false> + 4 +
                                 (long)(iVar21 >> 5) * 4);
                *puVar4 = *puVar4 | uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                    (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
              }
              sVar28 = sVar28 + 1;
            } while (sVar40._M_len != sVar28);
          }
        }
        else {
          local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)sVar40._M_len * 8;
          local_178.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar40._M_str;
          ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
          emplace_back<char_const*,int>(local_2a0,(char **)&local_178,(int *)&local_2e0);
        }
      }
      if ((pointer)local_1f8._M_len != (pointer)0x0) {
        operator_delete((void *)local_1f8._M_len,(long)local_1e8 - local_1f8._M_len);
      }
      key_28._M_str = "mask";
      key_28._M_len = 4;
      bdecode_node::dict_find_string((bdecode_node *)&local_1f8,&local_288,key_28);
      bVar15 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_1f8);
      if (bVar15) {
        sVar40 = bdecode_node::string_value((bdecode_node *)&local_1f8);
        if (local_298 == 1) {
          local_178.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_178.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar40._M_len)
          ;
          ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
          emplace_back<int>((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)
                            local_240,(int *)&local_178);
          if (sVar40._M_len != 0) {
            pbVar5 = (__return_storage_ptr__->merkle_tree_mask).
                     super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                     super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar28 = 0;
            do {
              if ((&((pointer)sVar40._M_str)->field_0x0)[sVar28] == '1') {
                uVar20 = 0x80000000 >> ((byte)sVar28 & 0x1f);
                iVar19 = (int)sVar28;
                iVar21 = iVar19 + 0x1f;
                if (-1 < iVar19) {
                  iVar21 = iVar19;
                }
                puVar4 = (uint *)((long)pbVar5[-1].m_buf.
                                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false> + 4 +
                                 (long)(iVar21 >> 5) * 4);
                *puVar4 = *puVar4 | uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                    (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
              }
              sVar28 = sVar28 + 1;
            } while (sVar40._M_len != sVar28);
          }
        }
        else {
          local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)sVar40._M_len * 8;
          local_178.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar40._M_str;
          ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
          emplace_back<char_const*,int>(local_240,(char **)&local_178,(int *)&local_2e0);
        }
      }
      if ((pointer)local_1f8._M_len != (pointer)0x0) {
        operator_delete((void *)local_1f8._M_len,(long)local_1e8 - local_1f8._M_len);
      }
      pvVar12 = (void *)CONCAT44(local_238.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_238.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar12 != (void *)0x0) {
        operator_delete(pvVar12,(long)local_238.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar12);
      }
      if (local_288.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_288.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  key_05._M_str = "total_uploaded";
  key_05._M_len = 0xe;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_05,0);
  __return_storage_ptr__->total_uploaded = iVar23;
  key_06._M_str = "total_downloaded";
  key_06._M_len = 0x10;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_06,0);
  __return_storage_ptr__->total_downloaded = iVar23;
  key_07._M_str = "active_time";
  key_07._M_len = 0xb;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_07,0);
  __return_storage_ptr__->active_time = (int)iVar23;
  key_08._M_str = "finished_time";
  key_08._M_len = 0xd;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_08,0);
  __return_storage_ptr__->finished_time = (int)iVar23;
  key_09._M_str = "seeding_time";
  key_09._M_len = 0xc;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_09,0);
  __return_storage_ptr__->seeding_time = (int)iVar23;
  key_10._M_str = "last_seen_complete";
  key_10._M_len = 0x12;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_10,0);
  __return_storage_ptr__->last_seen_complete = iVar23;
  key_11._M_str = "last_download";
  key_11._M_len = 0xd;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_11,0);
  __return_storage_ptr__->last_download = iVar23;
  key_12._M_str = "last_upload";
  key_12._M_len = 0xb;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_12,0);
  __return_storage_ptr__->last_upload = iVar23;
  key_13._M_str = "num_complete";
  key_13._M_len = 0xc;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_13,-1);
  __return_storage_ptr__->num_complete = (int)iVar23;
  key_14._M_str = "num_incomplete";
  key_14._M_len = 0xe;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_14,-1);
  __return_storage_ptr__->num_incomplete = (int)iVar23;
  key_15._M_str = "num_downloaded";
  key_15._M_len = 0xe;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_15,-1);
  __return_storage_ptr__->num_downloaded = (int)iVar23;
  key_16._M_str = "max_uploads";
  key_16._M_len = 0xb;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_16,-1);
  __return_storage_ptr__->max_uploads = (int)iVar23;
  key_17._M_str = "max_connections";
  key_17._M_len = 0xf;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_17,-1);
  __return_storage_ptr__->max_connections = (int)iVar23;
  key_18._M_str = "upload_rate_limit";
  key_18._M_len = 0x11;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_18,-1);
  __return_storage_ptr__->upload_limit = (int)iVar23;
  key_19._M_str = "download_rate_limit";
  key_19._M_len = 0x13;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_19,-1);
  __return_storage_ptr__->download_limit = (int)iVar23;
  current_flags = &__return_storage_ptr__->flags;
  anon_unknown_27::apply_flag(current_flags,rd,"seed_mode",(torrent_flags_t)0x1);
  anon_unknown_27::apply_flag(current_flags,rd,"upload_mode",(torrent_flags_t)0x2);
  anon_unknown_27::apply_flag(current_flags,rd,"share_mode",(torrent_flags_t)0x4);
  anon_unknown_27::apply_flag(current_flags,rd,"apply_ip_filter",(torrent_flags_t)0x8);
  anon_unknown_27::apply_flag(current_flags,rd,"paused",(torrent_flags_t)0x10);
  anon_unknown_27::apply_flag(current_flags,rd,"auto_managed",(torrent_flags_t)0x20);
  anon_unknown_27::apply_flag(current_flags,rd,"super_seeding",(torrent_flags_t)0x100);
  anon_unknown_27::apply_flag(current_flags,rd,"i2p",(torrent_flags_t)0x1000000);
  anon_unknown_27::apply_flag(current_flags,rd,"sequential_download",(torrent_flags_t)0x200);
  anon_unknown_27::apply_flag(current_flags,rd,"stop_when_ready",(torrent_flags_t)0x400);
  anon_unknown_27::apply_flag(current_flags,rd,"disable_dht",(torrent_flags_t)0x80000);
  anon_unknown_27::apply_flag(current_flags,rd,"disable_lsd",(torrent_flags_t)0x100000);
  anon_unknown_27::apply_flag(current_flags,rd,"disable_pex",(torrent_flags_t)0x200000);
  key_20._M_str = "save_path";
  key_20._M_len = 9;
  local_2a0 = (vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)current_flags;
  sVar40 = bdecode_node::dict_find_string_value(rd,key_20,(string_view)ZEXT816(0));
  ::std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->save_path,0,
             (char *)(__return_storage_ptr__->save_path)._M_string_length,(ulong)sVar40._M_str);
  key_29._M_str = "mapped_files";
  key_29._M_len = 0xc;
  bdecode_node::dict_find_list(&local_288,rd,key_29);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_288);
  if (bVar15) {
    for (iVar18 = 0; iVar19 = bdecode_node::list_size(&local_288), iVar18 < iVar19;
        iVar18 = iVar18 + 1) {
      sVar40 = bdecode_node::list_string_value_at(&local_288,iVar18,(string_view)ZEXT816(0));
      if (sVar40._M_len != 0) {
        local_238.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar18;
        pmVar24 = ::std::
                  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(__return_storage_ptr__->renamed_files).
                                super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ,(key_type *)&local_238);
        ::std::__cxx11::string::_M_replace
                  ((ulong)pmVar24,0,(char *)pmVar24->_M_string_length,(ulong)sVar40._M_str);
      }
    }
  }
  key_21._M_str = "added_time";
  key_21._M_len = 10;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_21,0);
  __return_storage_ptr__->added_time = iVar23;
  key_22._M_str = "completed_time";
  key_22._M_len = 0xe;
  iVar23 = bdecode_node::dict_find_int_value(rd,key_22,0);
  __return_storage_ptr__->completed_time = iVar23;
  key_30._M_str = "file_priority";
  key_30._M_len = 0xd;
  bdecode_node::dict_find_list(&local_238,rd,key_30);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_238);
  if (bVar15) {
    uVar20 = bdecode_node::list_size(&local_238);
    this = &__return_storage_ptr__->file_priorities;
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(this,(long)(int)uVar20,(value_type *)&default_priority);
    if (0 < (int)uVar20) {
      uVar33 = 0;
      do {
        iVar23 = bdecode_node::list_int_value_at(&local_238,(int)uVar33,4);
        bVar16 = (byte)iVar23;
        if (6 < bVar16) {
          bVar16 = 7;
        }
        (this->
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar33].m_val = bVar16;
        if ((this->
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar33].m_val == '\0') {
          local_2a0->field_0x0 = (byte)*(unsigned_long *)&local_2a0->field_0x0 & 0xfe;
        }
        uVar33 = uVar33 + 1;
      } while (uVar20 != uVar33);
    }
  }
  key_31._M_str = "trackers";
  key_31._M_len = 8;
  bdecode_node::dict_find_list((bdecode_node *)&local_1f8,rd,key_31);
  bVar15 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_1f8);
  if (bVar15) {
    pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
    *pbVar1 = *pbVar1 | 8;
    local_1b8[0]._0_4_ = 0;
    for (iVar18 = 0; iVar19 = bdecode_node::list_size((bdecode_node *)&local_1f8), iVar18 < iVar19;
        iVar18 = iVar18 + 1) {
      bdecode_node::list_at(&local_178,(bdecode_node *)&local_1f8,iVar18);
      bVar15 = bdecode_node::operator_cast_to_bool(&local_178);
      if ((bVar15) && (tVar17 = bdecode_node::type(&local_178), tVar17 == list_t)) {
        for (iVar19 = 0; iVar21 = bdecode_node::list_size(&local_178), iVar19 < iVar21;
            iVar19 = iVar19 + 1) {
          local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._0_16_ =
               bdecode_node::list_string_value_at(&local_178,iVar19,(string_view)ZEXT816(0));
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->trackers,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_2e0);
          __position_00._M_current =
               (__return_storage_ptr__->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (__return_storage_ptr__->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->tracker_tiers,
                       __position_00,(int *)local_1b8);
          }
          else {
            *__position_00._M_current = local_1b8[0]._0_4_;
            (__return_storage_ptr__->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
          bVar15 = aux::is_i2p_url((string *)
                                   ((__return_storage_ptr__->trackers).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1));
          if (bVar15) {
            pbVar1 = (byte *)((long)&local_2a0->field_0x0 + 3);
            *pbVar1 = *pbVar1 | 1;
          }
        }
        local_1b8[0]._0_4_ = local_1b8[0]._0_4_ + 1;
      }
      if (local_178.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_178.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  key_32._M_str = "url-list";
  key_32._M_len = 8;
  bdecode_node::dict_find_list(&local_178,rd,key_32);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_178);
  if (bVar15) {
    pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
    *pbVar1 = *pbVar1 | 0x10;
    for (iVar18 = 0; iVar19 = bdecode_node::list_size(&local_178), iVar18 < iVar19;
        iVar18 = iVar18 + 1) {
      local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._0_16_ =
           bdecode_node::list_string_value_at(&local_178,iVar18,(string_view)ZEXT816(0));
      if (local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != 0) {
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->url_seeds,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_2e0);
      }
    }
  }
  key_33._M_str = "pieces";
  key_33._M_len = 6;
  bdecode_node::dict_find_string(&local_2e0,rd,key_33);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    if (local_298 == 2) {
      sVar40 = bdecode_node::string_value(&local_2e0);
      bitfield::assign(&(__return_storage_ptr__->have_pieces).super_bitfield,sVar40._M_str,
                       (int)sVar40._M_len << 3);
    }
    else if (local_298 == 1) {
      pcVar25 = bdecode_node::string_ptr(&local_2e0);
      iVar18 = bdecode_node::string_length(&local_2e0);
      bitfield::resize(&(__return_storage_ptr__->have_pieces).super_bitfield,iVar18);
      this_00 = &__return_storage_ptr__->verified_pieces;
      bitfield::resize(&this_00->super_bitfield,iVar18);
      _Var6._M_head_impl =
           *(uint **)&(this_00->super_bitfield).m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      tVar7.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
           (__return_storage_ptr__->have_pieces).super_bitfield.m_buf.
           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      uVar33 = 0;
      bVar15 = false;
      while( true ) {
        if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var6._M_head_impl ==
            (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
          lVar31 = 0;
        }
        else {
          lVar31 = (long)(int)*_Var6._M_head_impl;
        }
        if (lVar31 <= (long)uVar33) break;
        uVar20 = 0x80000000 >> ((byte)uVar33 & 0x1f);
        if ((pcVar25[uVar33] & 1U) == 0) {
          uVar20 = ~uVar20;
          puVar4 = (uint *)((long)tVar7.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4 +
                           (uVar33 >> 5 & 0x7ffffff) * 4);
          *puVar4 = *puVar4 & (uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                              uVar20 << 0x18);
        }
        else {
          puVar4 = (uint *)((long)tVar7.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4 +
                           (uVar33 >> 5 & 0x7ffffff) * 4);
          *puVar4 = *puVar4 | uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                              uVar20 << 0x18;
        }
        uVar20 = 0x80000000 >> ((byte)uVar33 & 0x1f);
        if ((pcVar25[uVar33] & 2U) == 0) {
          uVar20 = ~uVar20;
          (_Var6._M_head_impl + 1)[uVar33 >> 5 & 0x7ffffff] =
               (_Var6._M_head_impl + 1)[uVar33 >> 5 & 0x7ffffff] &
               (uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18)
          ;
        }
        else {
          (_Var6._M_head_impl + 1)[uVar33 >> 5 & 0x7ffffff] =
               (_Var6._M_head_impl + 1)[uVar33 >> 5 & 0x7ffffff] |
               uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
          bVar15 = true;
        }
        uVar33 = uVar33 + 1;
      }
      if ((!bVar15) &&
         ((this_00->super_bitfield).m_buf.
          super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
               (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0,
         _Var6._M_head_impl != (uint *)0x0)) {
        operator_delete__(_Var6._M_head_impl);
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_34._M_str = "verified";
  key_34._M_len = 8;
  bdecode_node::dict_find_string(&local_2e0,rd,key_34);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    sVar40 = bdecode_node::string_value(&local_2e0);
    bitfield::assign(&(__return_storage_ptr__->verified_pieces).super_bitfield,sVar40._M_str,
                     (int)sVar40._M_len << 3);
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_35._M_str = "piece_priority";
  key_35._M_len = 0xe;
  bdecode_node::dict_find_string(&local_2e0,rd,key_35);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    pcVar25 = bdecode_node::string_ptr(&local_2e0);
    iVar18 = bdecode_node::string_length(&local_2e0);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&__return_storage_ptr__->piece_priorities,(long)iVar18);
    psVar26 = (__return_storage_ptr__->piece_priorities).
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->piece_priorities).
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar26) {
      uVar33 = 0;
      do {
        bVar16 = pcVar25[uVar33];
        if (6 < (byte)pcVar25[uVar33]) {
          bVar16 = 7;
        }
        psVar26[uVar33].m_val = bVar16;
        uVar33 = uVar33 + 1;
        psVar26 = (__return_storage_ptr__->piece_priorities).
                  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar33 < (ulong)((long)(__return_storage_ptr__->piece_priorities).
                                      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar26));
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_36._M_str = "peers";
  key_36._M_len = 5;
  bdecode_node::dict_find_string(&local_2e0,rd,key_36);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar18 = 5; iVar19 = bdecode_node::string_length(&local_2e0), iVar18 < iVar19;
        iVar18 = iVar18 + 6) {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base,(aux *)&local_90,in);
      iVar8._M_current =
           (__return_storage_ptr__->peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (__return_storage_ptr__->peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->peers,iVar8,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base);
      }
      else {
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_1b8[0]._16_4_,local_1b8[0]._12_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_1b8[0].v6.sin6_scope_id,local_1b8[0]._20_4_);
        *(ulong *)&((iVar8._M_current)->impl_).data_ =
             CONCAT44(local_1b8[0].v6.sin6_flowinfo,local_1b8[0]._0_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 8) =
             CONCAT44(local_1b8[0]._12_4_,local_1b8[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_37._M_str = "peers6";
  key_37._M_len = 6;
  bdecode_node::dict_find_string(&local_2e0,rd,key_37);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar18 = 0x11; iVar19 = bdecode_node::string_length(&local_2e0), iVar18 < iVar19;
        iVar18 = iVar18 + 0x12) {
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base,(aux *)&local_90,in_00);
      iVar8._M_current =
           (__return_storage_ptr__->peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (__return_storage_ptr__->peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->peers,iVar8,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base);
      }
      else {
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_1b8[0]._16_4_,local_1b8[0]._12_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_1b8[0].v6.sin6_scope_id,local_1b8[0]._20_4_);
        *(ulong *)&((iVar8._M_current)->impl_).data_ =
             CONCAT44(local_1b8[0].v6.sin6_flowinfo,local_1b8[0]._0_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 8) =
             CONCAT44(local_1b8[0]._12_4_,local_1b8[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_38._M_str = "banned_peers";
  key_38._M_len = 0xc;
  bdecode_node::dict_find_string(&local_2e0,rd,key_38);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar18 = 6; iVar19 = bdecode_node::string_length(&local_2e0), iVar18 < iVar19;
        iVar18 = iVar18 + 6) {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base,(aux *)&local_90,in_01);
      iVar8._M_current =
           (__return_storage_ptr__->banned_peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (__return_storage_ptr__->banned_peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->banned_peers,iVar8,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base);
      }
      else {
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_1b8[0]._16_4_,local_1b8[0]._12_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_1b8[0].v6.sin6_scope_id,local_1b8[0]._20_4_);
        *(ulong *)&((iVar8._M_current)->impl_).data_ =
             CONCAT44(local_1b8[0].v6.sin6_flowinfo,local_1b8[0]._0_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 8) =
             CONCAT44(local_1b8[0]._12_4_,local_1b8[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->banned_peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_39._M_str = "banned_peers6";
  key_39._M_len = 0xd;
  bdecode_node::dict_find_string(&local_2e0,rd,key_39);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar18 = 0x11; iVar19 = bdecode_node::string_length(&local_2e0), iVar18 < iVar19;
        iVar18 = iVar18 + 0x12) {
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base,(aux *)&local_90,in_02);
      iVar8._M_current =
           (__return_storage_ptr__->banned_peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (__return_storage_ptr__->banned_peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->banned_peers,iVar8,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_1b8[0].base);
      }
      else {
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_1b8[0]._16_4_,local_1b8[0]._12_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_1b8[0].v6.sin6_scope_id,local_1b8[0]._20_4_);
        *(ulong *)&((iVar8._M_current)->impl_).data_ =
             CONCAT44(local_1b8[0].v6.sin6_flowinfo,local_1b8[0]._0_4_);
        *(ulong *)((long)&((iVar8._M_current)->impl_).data_ + 8) =
             CONCAT44(local_1b8[0]._12_4_,local_1b8[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->banned_peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_40._M_str = "unfinished";
  key_40._M_len = 10;
  bdecode_node::dict_find_list(&local_2e0,rd,key_40);
  bVar15 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar15) {
    for (iVar18 = 0; iVar19 = bdecode_node::list_size(&local_2e0), iVar18 < iVar19;
        iVar18 = iVar18 + 1) {
      bdecode_node::list_at((bdecode_node *)&local_1b8[0].base,&local_2e0,iVar18);
      tVar17 = bdecode_node::type((bdecode_node *)&local_1b8[0].base);
      if (tVar17 == dict_t) {
        key_23._M_str = "piece";
        key_23._M_len = 5;
        iVar23 = bdecode_node::dict_find_int_value((bdecode_node *)&local_1b8[0].base,key_23,-1);
        local_28c.m_val = (int)iVar23;
        if (-1 < local_28c.m_val) {
          key_41._M_str = "bitmask";
          key_41._M_len = 7;
          bdecode_node::dict_find_string(&local_90,(bdecode_node *)&local_1b8[0].base,key_41);
          bVar15 = bdecode_node::operator_cast_to_bool(&local_90);
          if ((bVar15) && (iVar19 = bdecode_node::string_length(&local_90), iVar19 != 0)) {
            this_02 = ::std::
                      map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                      ::operator[](&(__return_storage_ptr__->unfinished_pieces).
                                    super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                                   ,&local_28c);
            pcVar25 = bdecode_node::string_ptr(&local_90);
            iVar19 = bdecode_node::string_length(&local_90);
            bitfield::assign(this_02,pcVar25,iVar19 << 3);
          }
          if (local_90.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pvVar12 = (void *)CONCAT44(local_1b8[0].v6.sin6_flowinfo,local_1b8[0]._0_4_);
      if (pvVar12 != (void *)0x0) {
        operator_delete(pvVar12,CONCAT44(local_1b8[0]._20_4_,local_1b8[0]._16_4_) - (long)pvVar12);
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pbVar1 = (byte *)((long)&local_2a0->field_0x0 + 1);
  *pbVar1 = *pbVar1 & 0xdf;
  if (local_178.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1f8._M_len != (pointer)0x0) {
    operator_delete((void *)local_1f8._M_len,(long)local_1e8 - local_1f8._M_len);
  }
  pvVar12 = (void *)CONCAT44(local_238.m_tokens.
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_238.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)local_238.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar12
                   );
  }
  if (local_288.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT17(local_138.m_tokens.
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                             CONCAT16(local_138.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_,
                                      CONCAT15(local_138.m_tokens.
                                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _5_1_,CONCAT14(local_138.m_tokens.
                                                                                                                            
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,(uint)local_138.m_tokens.
                                                                                                                              
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )))) -
                    (long)local_138.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(local_f0.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_f0.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_f0.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(bdecode_node const& rd, error_code& ec
		, int const piece_limit)
	{
		add_torrent_params ret;
		if (rd.type() != bdecode_node::dict_t)
		{
			ec = errors::not_a_dictionary;
			return ret;
		}

		if (bdecode_node const alloc = rd.dict_find_string("allocation"))
		{
			ret.storage_mode = (alloc.string_value() == "allocate"
				|| alloc.string_value() == "full")
				? storage_mode_allocate : storage_mode_sparse;
		}

		if (rd.dict_find_string_value("file-format")
			!= "libtorrent resume file")
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		std::int64_t const file_version = rd.dict_find_int_value("file-version", 1);

		if (file_version != 1 && file_version != 2)
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		auto info_hash = rd.dict_find_string_value("info-hash");
		auto info_hash2 = rd.dict_find_string_value("info-hash2");
		if (info_hash.size() != std::size_t(sha1_hash::size())
			&& info_hash2.size() != std::size_t(sha256_hash::size()))
		{
			ec = errors::missing_info_hash;
			return ret;
		}

		ret.name = rd.dict_find_string_value("name");

		if (info_hash.size() == 20)
			ret.info_hashes.v1.assign(info_hash.data());
		if (info_hash2.size() == 32)
			ret.info_hashes.v2.assign(info_hash2.data());

		bdecode_node const info = rd.dict_find_dict("info");
		if (info)
		{
			// verify the info-hash of the metadata stored in the resume file matches
			// the torrent we're loading
			info_hash_t const resume_ih(hasher(info.data_section()).final()
				, hasher256(info.data_section()).final());

			// if url is set, the info_hash is not actually the info-hash of the
			// torrent, but the hash of the URL, until we have the full torrent
			// only require the info-hash to match if we actually passed in one
			if ((!ret.info_hashes.has_v1() || resume_ih.v1 == ret.info_hashes.v1)
				&& (!ret.info_hashes.has_v2() || resume_ih.v2 == ret.info_hashes.v2))
			{
				auto ti = std::make_shared<torrent_info>(resume_ih);

				error_code err;
				if (!ti->parse_info_section(info, err, piece_limit))
				{
					ec = err;
				}
				else
				{
					// time_t might be 32 bit if we're unlucky, but there isn't
					// much to do about it
					ti->internal_set_creation_date(static_cast<std::time_t>(
						rd.dict_find_int_value("creation date", 0)));
					ti->internal_set_creator(rd.dict_find_string_value("created by", ""));
					ti->internal_set_comment(rd.dict_find_string_value("comment", ""));
				}
				ret.ti = std::move(ti);
			}
			else
			{
				ec = errors::mismatching_info_hash;
			}
		}

#if TORRENT_ABI_VERSION < 3
		ret.info_hash = ret.info_hashes.get_best();
#endif

		bdecode_node const trees = rd.dict_find_list("trees");
		if (trees)
		{
			ret.merkle_trees.reserve(trees.list_size());
			ret.verified_leaf_hashes.reserve(trees.list_size());
			for (int i = 0; i < trees.list_size(); ++i)
			{
				auto de = trees.list_at(i);
				if (de.type() != bdecode_node::dict_t)
					break;
				auto dh = de.dict_find_string("hashes");
				if (!dh || dh.string_length() % 32 != 0) break;

				ret.merkle_trees.emplace_back();
				ret.merkle_trees.back().reserve(dh.string_value().size() / 32);
				for (auto hashes = dh.string_value();
					!hashes.empty(); hashes = hashes.substr(32))
				{
					ret.merkle_trees.back().emplace_back(hashes);
				}

				if (bdecode_node const verified = de.dict_find_string("verified"))
				{
					string_view const str = verified.string_value();
					if (file_version == 1)
					{
						ret.verified_leaf_hashes.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.verified_leaf_hashes.back().set_bit(int(j));
						}
					}
					else
					{
						ret.verified_leaf_hashes.emplace_back(str.data(), int(str.size()) * 8);
					}
				}

				if (bdecode_node const mask = de.dict_find_string("mask"))
				{
					string_view const str = mask.string_value();
					if (file_version == 1)
					{
						ret.merkle_tree_mask.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.merkle_tree_mask.back().set_bit(int(j));
						}
					}
					else
					{
						ret.merkle_tree_mask.emplace_back(str.data(), int(str.size()) * 8);
					}
				}
			}
		}

		ret.total_uploaded = rd.dict_find_int_value("total_uploaded");
		ret.total_downloaded = rd.dict_find_int_value("total_downloaded");

		ret.active_time = int(rd.dict_find_int_value("active_time"));
		ret.finished_time = int(rd.dict_find_int_value("finished_time"));
		ret.seeding_time = int(rd.dict_find_int_value("seeding_time"));

		ret.last_seen_complete = std::time_t(rd.dict_find_int_value("last_seen_complete"));

		ret.last_download = std::time_t(rd.dict_find_int_value("last_download", 0));
		ret.last_upload = std::time_t(rd.dict_find_int_value("last_upload", 0));

		// scrape data cache
		ret.num_complete = int(rd.dict_find_int_value("num_complete", -1));
		ret.num_incomplete = int(rd.dict_find_int_value("num_incomplete", -1));
		ret.num_downloaded = int(rd.dict_find_int_value("num_downloaded", -1));

		// torrent settings
		ret.max_uploads = int(rd.dict_find_int_value("max_uploads", -1));
		ret.max_connections = int(rd.dict_find_int_value("max_connections", -1));
		ret.upload_limit = int(rd.dict_find_int_value("upload_rate_limit", -1));
		ret.download_limit = int(rd.dict_find_int_value("download_rate_limit", -1));

		// torrent flags
		apply_flag(ret.flags, rd, "seed_mode", torrent_flags::seed_mode);
		apply_flag(ret.flags, rd, "upload_mode", torrent_flags::upload_mode);
#ifndef TORRENT_DISABLE_SHARE_MODE
		apply_flag(ret.flags, rd, "share_mode", torrent_flags::share_mode);
#endif
		apply_flag(ret.flags, rd, "apply_ip_filter", torrent_flags::apply_ip_filter);
		apply_flag(ret.flags, rd, "paused", torrent_flags::paused);
		apply_flag(ret.flags, rd, "auto_managed", torrent_flags::auto_managed);
#ifndef TORRENT_DISABLE_SUPERSEEDING
		apply_flag(ret.flags, rd, "super_seeding", torrent_flags::super_seeding);
#endif
#if TORRENT_USE_I2P
		apply_flag(ret.flags, rd, "i2p", torrent_flags::i2p_torrent);
#endif
		apply_flag(ret.flags, rd, "sequential_download", torrent_flags::sequential_download);
		apply_flag(ret.flags, rd, "stop_when_ready", torrent_flags::stop_when_ready);
		apply_flag(ret.flags, rd, "disable_dht", torrent_flags::disable_dht);
		apply_flag(ret.flags, rd, "disable_lsd", torrent_flags::disable_lsd);
		apply_flag(ret.flags, rd, "disable_pex", torrent_flags::disable_pex);

		ret.save_path = rd.dict_find_string_value("save_path");

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		ret.url = rd.dict_find_string_value("url");
#endif

		bdecode_node const mapped_files = rd.dict_find_list("mapped_files");
		if (mapped_files)
		{
			for (int i = 0; i < mapped_files.list_size(); ++i)
			{
				auto new_filename = mapped_files.list_string_value_at(i);
				if (new_filename.empty()) continue;
				ret.renamed_files[file_index_t(i)] = new_filename;
			}
		}

		ret.added_time = std::time_t(rd.dict_find_int_value("added_time", 0));
		ret.completed_time = std::time_t(rd.dict_find_int_value("completed_time", 0));

		// load file priorities except if the add_torrent_param file was set to
		// override resume data
		bdecode_node const file_priority = rd.dict_find_list("file_priority");
		if (file_priority)
		{
			int const num_files = file_priority.list_size();
			ret.file_priorities.resize(aux::numeric_cast<std::size_t>(num_files)
				, default_priority);
			for (int i = 0; i < num_files; ++i)
			{
				auto const idx = static_cast<std::size_t>(i);
				ret.file_priorities[idx] = std::clamp(
					download_priority_t(static_cast<std::uint8_t>(
						file_priority.list_int_value_at(i
							, static_cast<std::uint8_t>(default_priority))))
						, dont_download, top_priority);
				// this is suspicious, leave seed mode
				if (ret.file_priorities[idx] == dont_download)
				{
					ret.flags &= ~torrent_flags::seed_mode;
				}
			}
		}

		bdecode_node const trackers = rd.dict_find_list("trackers");
		if (trackers)
		{
			// it's possible to delete the trackers from a torrent and then save
			// resume data with an empty trackers list. Since we found a trackers
			// list here, these should replace whatever we find in the .torrent
			// file.
			ret.flags |= torrent_flags::deprecated_override_trackers;

			int tier = 0;
			for (int i = 0; i < trackers.list_size(); ++i)
			{
				bdecode_node const tier_list = trackers.list_at(i);
				if (!tier_list || tier_list.type() != bdecode_node::list_t)
					continue;

				for (int j = 0; j < tier_list.list_size(); ++j)
				{
					ret.trackers.emplace_back(tier_list.list_string_value_at(j));
					ret.tracker_tiers.push_back(tier);
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(ret.trackers.back())) ret.flags |= torrent_flags::i2p_torrent;
#endif
				}
				++tier;
			}
		}

		// if merge resume http seeds is not set, we need to clear whatever web
		// seeds we loaded from the .torrent file, because we want whatever's in
		// the resume file to take precedence. If there aren't even any fields in
		// the resume data though, keep the ones from the torrent
		bdecode_node const url_list = rd.dict_find_list("url-list");
		if (url_list)
		{
			// since we found http seeds in the resume data, they should replace
			// whatever web seeds are specified in the .torrent, by default
			ret.flags |= torrent_flags::deprecated_override_web_seeds;
			for (int i = 0; i < url_list.list_size(); ++i)
			{
				auto url = url_list.list_string_value_at(i);
				if (url.empty()) continue;
				ret.url_seeds.emplace_back(url);
			}
		}

		// some sanity checking. Maybe we shouldn't be in seed mode anymore
		if (bdecode_node const pieces = rd.dict_find_string("pieces"))
		{
			if (file_version == 1)
			{
				char const* pieces_str = pieces.string_ptr();
				int const pieces_len = pieces.string_length();
				ret.have_pieces.resize(pieces_len);
				ret.verified_pieces.resize(pieces_len);
				bool any_verified = false;
				for (piece_index_t i(0); i < ret.verified_pieces.end_index(); ++i)
				{
					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (pieces_str[static_cast<int>(i)] & 1) ret.have_pieces.set_bit(i);
					else ret.have_pieces.clear_bit(i);

					if (pieces_str[static_cast<int>(i)] & 2)
					{
						ret.verified_pieces.set_bit(i);
						any_verified = true;
					}
					else
					{
						ret.verified_pieces.clear_bit(i);
					}
				}
				if (!any_verified) ret.verified_pieces.clear();
			}
			else if (file_version == 2)
			{
				string_view const str = pieces.string_value();
				ret.have_pieces.assign(str.data(), int(str.size()) * 8);
			}
		}

		if (bdecode_node const verified = rd.dict_find_string("verified"))
		{
			string_view const str = verified.string_value();
			ret.verified_pieces.assign(str.data(), int(str.size()) * 8);
		}

		if (bdecode_node const piece_priority = rd.dict_find_string("piece_priority"))
		{
			char const* prio_str = piece_priority.string_ptr();
			ret.piece_priorities.resize(aux::numeric_cast<std::size_t>(piece_priority.string_length()));
			for (std::size_t i = 0; i < ret.piece_priorities.size(); ++i)
			{
				ret.piece_priorities[i] = download_priority_t(std::clamp(
					static_cast<std::uint8_t>(prio_str[i])
					, static_cast<std::uint8_t>(dont_download)
					, static_cast<std::uint8_t>(top_priority)));
			}
		}

		int const v6_size = 18;
		int const v4_size = 6;
		using namespace libtorrent::aux; // for read_*_endpoint()
		if (bdecode_node const peers_entry = rd.dict_find_string("peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size - 1; i < peers_entry.string_length(); i += v4_size)
				ret.peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size; i < peers_entry.string_length(); i += v4_size)
				ret.banned_peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.banned_peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		// parse unfinished pieces
		if (bdecode_node const unfinished_entry = rd.dict_find_list("unfinished"))
		{
			for (int i = 0; i < unfinished_entry.list_size(); ++i)
			{
				bdecode_node const e = unfinished_entry.list_at(i);
				if (e.type() != bdecode_node::dict_t) continue;
				piece_index_t const piece = piece_index_t(int(e.dict_find_int_value("piece", -1)));
				if (piece < piece_index_t(0)) continue;

				bdecode_node const bitmask = e.dict_find_string("bitmask");
				if (!bitmask || bitmask.string_length() == 0) continue;
				ret.unfinished_pieces[piece].assign(
					bitmask.string_ptr(), bitmask.string_length() * CHAR_BIT);
			}
		}

		// we're loading this torrent from resume data. There's no need to
		// re-save the resume data immediately.
		ret.flags &= ~torrent_flags::need_save_resume;

		return ret;
	}